

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void nni_sha1_final(nni_sha1_ctx *ctx,uint8_t *digest)

{
  int iVar1;
  ulong uVar2;
  int i;
  long lVar3;
  
  lVar3 = (long)ctx->idx;
  ctx->idx = ctx->idx + 1;
  if (lVar3 < 0x38) {
    ctx->blk[lVar3] = 0x80;
    iVar1 = ctx->idx;
    while (iVar1 < 0x38) {
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
      iVar1 = ctx->idx;
    }
  }
  else {
    ctx->blk[lVar3] = 0x80;
    iVar1 = ctx->idx;
    while (iVar1 < 0x40) {
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
      iVar1 = ctx->idx;
    }
    nni_sha1_process(ctx);
    iVar1 = ctx->idx;
    while (iVar1 < 0x38) {
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
      iVar1 = ctx->idx;
    }
  }
  uVar2 = ctx->len;
  *(ulong *)(ctx->blk + 0x38) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  nni_sha1_process(ctx);
  lVar3 = 0;
  do {
    digest[lVar3 * 4] = *(uint8_t *)((long)ctx->digest + lVar3 * 4 + 3);
    digest[lVar3 * 4 + 1] = *(uint8_t *)((long)ctx->digest + lVar3 * 4 + 2);
    digest[lVar3 * 4 + 2] = *(uint8_t *)((long)ctx->digest + lVar3 * 4 + 1);
    digest[lVar3 * 4 + 3] = (uint8_t)ctx->digest[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void
nni_sha1_final(nni_sha1_ctx *ctx, uint8_t digest[20])
{
	nni_sha1_pad(ctx);
	for (int i = 0; i < 5; i++) {
		digest[i * 4]     = (ctx->digest[i] >> 24) & 0xff;
		digest[i * 4 + 1] = (ctx->digest[i] >> 16) & 0xff;
		digest[i * 4 + 2] = (ctx->digest[i] >> 8) & 0xff;
		digest[i * 4 + 3] = (ctx->digest[i] >> 0) & 0xff;
	}
}